

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Column_settings *pCVar13;
  ulong uVar14;
  int local_82c;
  undefined8 local_828;
  undefined4 *local_820;
  undefined4 ****local_818;
  char *local_810;
  shared_count sStack_808;
  undefined8 *local_800;
  undefined **local_7f8;
  char *local_7f0;
  undefined8 *local_7e8;
  undefined4 **local_7e0;
  undefined4 local_7d4;
  undefined8 local_7d0;
  char *local_7c8;
  shared_count sStack_7c0;
  undefined4 ***local_7b8;
  ulong local_7b0;
  shared_count sStack_7a8;
  char *local_7a0;
  undefined4 **local_798;
  char *local_790;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mm;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mb;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mc1;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mr;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mc2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>>
            ();
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mb.colSettings_ = (Column_settings *)birth_comp;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.colSettings_ = (Column_settings *)death_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
              *)&m.matrix_,m.colSettings_,(function<bool_(unsigned_int,_unsigned_int)> *)&mb,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr);
  if (mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ != 0)
  {
    (*(code *)mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_)(&mr,&mr,3);
  }
  if (mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ != 0)
  {
    (*(code *)mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_)(&mb,&mb,3);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x15f);
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236060;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x1f3264;
  local_818 = &local_7b8;
  local_7b8 = (undefined4 ***)CONCAT44(local_7b8._4_4_,(int)m.matrix_.matrix_._M_h._M_element_count)
  ;
  local_7f8 = (undefined **)&local_7d0;
  mc2.colSettings_ =
       (Column_settings *)
       CONCAT71(mc2.colSettings_._1_7_,(int)m.matrix_.matrix_._M_h._M_element_count == 0);
  local_7d0 = (char *)((ulong)local_7d0._4_4_ << 0x20);
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ = 0;
  mm.colSettings_ = (Column_settings *)anon_var_dwarf_73949;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = "";
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)&local_818;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mb.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00235fd0;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)&local_7f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                     _M_functor + 8));
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mb.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
              *)&mb.matrix_,&ordered_boundaries,mb.colSettings_,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1);
  if (mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ != 0
     ) {
    (*(code *)mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_)(&mc1,&mc1,3);
  }
  if (mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ != 0)
  {
    (*(code *)mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_)(&mr,&mr,3);
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x163);
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236060;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x1f3264;
  local_7b8 = &local_798;
  mm.colSettings_ =
       (Column_settings *)
       CONCAT71(mm.colSettings_._1_7_,(int)mb.matrix_.matrix_._M_h._M_element_count == 7);
  local_798._0_4_ = 7;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ = 0;
  local_818 = (undefined4 ****)0x1f32e6;
  local_810 = "";
  local_7f8 = (undefined **)&local_7d0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00235fd0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)&local_7b8;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)&local_7f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                     _M_functor + 8));
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x164);
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236060;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x1f3264;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = mb.matrix_.matrix_._M_h._M_bucket_count;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar3,0);
  if (mb.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = mb.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 2) {
        local_7d0._0_4_ = *(int *)&p_Var2[4]._M_nxt;
        local_798._0_4_ = 0;
        mm.colSettings_ = (Column_settings *)CONCAT71(mm.colSettings_._1_7_,(int)local_7d0 == 0);
        mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
        ._M_object = (void *)0x0;
        mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ = 0
        ;
        local_818 = (undefined4 ****)0x1f32e6;
        local_810 = "";
        local_7f8 = (undefined **)&local_7d0;
        mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
        ._M_member_pointer =
             mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
             _M_unused._M_member_pointer & 0xffffffffffffff00;
        mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
        mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
             &boost::unit_test::lazy_ostream::inst;
        local_7b8 = &local_798;
        mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
        _M_unused._M_member_pointer =
             mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
             _M_unused._M_member_pointer & 0xffffffffffffff00;
        mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
        mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
             &boost::unit_test::lazy_ostream::inst;
        mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
             (_Manager_type)&local_7b8;
        mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
             (_Manager_type)&local_7f8;
        boost::test_tools::tt_detail::report_assertion
                  (&mm,&mc2,&local_818,0x164,1,2,2,"mb.get_column_dimension(2)",&mr,"0",&mc1);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   ((long)&mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                           _M_functor + 8));
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_168 = "";
        local_180 = &boost::unit_test::basic_cstring<char_const>::null;
        local_178 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x165);
        mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
        _M_unused._M_member_pointer =
             mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
             _M_unused._M_member_pointer & 0xffffffffffffff00;
        mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236060;
        mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
             &boost::unit_test::lazy_ostream::inst;
        mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
             (_Manager_type)0x1f3264;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = mb.matrix_.matrix_._M_h._M_bucket_count;
        uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar4,0);
        if (mb.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
          p_Var2 = mb.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
          uVar1 = *(uint *)&p_Var2[1]._M_nxt;
          do {
            if (uVar1 == 6) {
              local_7d0 = (char *)CONCAT44(local_7d0._4_4_,*(int *)&p_Var2[4]._M_nxt);
              local_798 = (undefined4 **)CONCAT44(local_798._4_4_,2);
              mm.colSettings_ =
                   (Column_settings *)CONCAT71(mm.colSettings_._1_7_,*(int *)&p_Var2[4]._M_nxt == 2)
              ;
              mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_object = (void *)0x0;
              mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = 0;
              local_818 = (undefined4 ****)0x1f32e6;
              local_810 = "";
              local_7f8 = (undefined **)&local_7d0;
              mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
              mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)&local_7b8;
              local_7b8 = &local_798;
              mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)&local_7f8;
              boost::test_tools::tt_detail::report_assertion
                        (&mm,&mc2,&local_818,0x165,1,2,2,"mb.get_column_dimension(6)",&mr,"2",&mc1);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         ((long)&mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                 super__Function_base._M_functor + 8));
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_object = (void *)0x0;
              mc1.colSettings_ = (Column_settings *)birth_comp;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   std::
                   _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                   ::_M_invoke;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = std::
                      _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                      ::_M_manager;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_object = (void *)0x0;
              mc2.colSettings_ = (Column_settings *)death_comp;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   std::
                   _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                   ::_M_invoke;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = std::
                      _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                      ::_M_manager;
              mr.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
              ::
              Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
                        ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
                          *)&mr.matrix_,5,mr.colSettings_,
                         (function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
                         (function<bool_(unsigned_int,_unsigned_int)> *)&mc2);
              if (mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                  _M_functor._8_8_ != 0) {
                (*(code *)mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_functor._8_8_)(&mc2,&mc2,3);
              }
              if (mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                  _M_functor._8_8_ != 0) {
                (*(code *)mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_functor._8_8_)(&mc1,&mc1,3);
              }
              local_190 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_188 = "";
              local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_198 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x169);
              mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236060;
              mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)0x1f3264;
              local_798 = (undefined4 **)
                          CONCAT44(local_798._4_4_,(int)mr.matrix_.matrix_._M_h._M_element_count);
              local_7d0 = (char *)&local_828;
              local_818 = (undefined4 ****)
                          CONCAT71(local_818._1_7_,
                                   (int)mr.matrix_.matrix_._M_h._M_element_count == 0);
              local_828 = (int *)((ulong)local_828._4_4_ << 0x20);
              local_810 = (char *)0x0;
              sStack_808.pi_ = (sp_counted_base *)0x0;
              local_7f8 = (undefined **)0x1f32e6;
              local_7f0 = "";
              local_7b8 = &local_798;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00235fd0;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)&local_7b8;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)&local_7d0;
              boost::test_tools::tt_detail::report_assertion
                        (&local_818,&mm,&local_7f8,0x169,1,2,2,"mr.get_number_of_columns()",&mc1,"0"
                         ,&mc2);
              boost::detail::shared_count::~shared_count(&sStack_808);
              mc1.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
              ::Chain_matrix(&mc1.matrix_,&mb.matrix_,mc1.colSettings_);
              mc2.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
              ::Chain_matrix(&mc2.matrix_,&mb.matrix_,mc2.colSettings_);
              local_1b0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1a8 = "";
              local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x16e);
              local_7f0 = (char *)((ulong)local_7f0 & 0xffffffffffffff00);
              local_7f8 = &PTR__lazy_ostream_00236060;
              local_7e8 = &boost::unit_test::lazy_ostream::inst;
              local_7e0 = (undefined4 **)0x1f3264;
              local_798 = &local_820;
              local_828 = &local_82c;
              local_82c = 7;
              local_7b0 = 0;
              sStack_7a8.pi_ = (sp_counted_base *)0x0;
              local_7d0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_7c8 = "";
              mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _M_unused._M_member_pointer =
                   mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                   _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
              mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00235fd0;
              mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
              _8_8_ = &boost::unit_test::lazy_ostream::inst;
              local_810 = (char *)((ulong)local_810 & 0xffffffffffffff00);
              local_818 = (undefined4 ****)&PTR__lazy_ostream_00236020;
              sStack_808.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
              local_800 = &local_828;
              mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
                   (_Manager_type)&local_798;
              local_7b8._0_1_ = (int)mc1.matrix_.matrix_._M_h._M_element_count == 7;
              boost::test_tools::tt_detail::report_assertion();
              boost::detail::shared_count::~shared_count(&sStack_7a8);
              local_1d0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1c8 = "";
              local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x16f);
              local_7f0 = (char *)((ulong)local_7f0 & 0xffffffffffffff00);
              local_7f8 = &PTR__lazy_ostream_00236060;
              local_7e8 = &boost::unit_test::lazy_ostream::inst;
              local_7e0 = (undefined4 **)0x1f3264;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = mc1.matrix_.matrix_._M_h._M_bucket_count;
              uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar5,0);
              if (mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] != (__node_base_ptr)0x0)
              {
                p_Var2 = mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
                uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                do {
                  if (uVar1 == 2) {
                    local_820._0_4_ = *(int *)&p_Var2[4]._M_nxt;
                    local_82c = 0;
                    local_7b8._0_1_ = (int)local_820 == 0;
                    local_7b0 = 0;
                    sStack_7a8.pi_ = (sp_counted_base *)0x0;
                    local_7d0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_7c8 = "";
                    local_798 = &local_820;
                    mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                    _M_functor._M_unused._M_member_pointer =
                         mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                         _M_functor._M_unused._M_member_pointer & 0xffffffffffffff00;
                    mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
                    mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                    _M_functor._8_8_ = &boost::unit_test::lazy_ostream::inst;
                    local_828 = &local_82c;
                    local_810 = (char *)((ulong)local_810 & 0xffffffffffffff00);
                    local_818 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                    sStack_808.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                    local_800 = &local_828;
                    mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                    _M_manager = (_Manager_type)&local_798;
                    boost::test_tools::tt_detail::report_assertion
                              (&local_7b8,&local_7f8,&local_7d0,0x16f,1,2,2,
                               "mc1.get_column_dimension(2)",&mm,"0",&local_818);
                    boost::detail::shared_count::~shared_count(&sStack_7a8);
                    local_1f0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_1e8 = "";
                    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,
                               0x170);
                    local_7f0 = (char *)((ulong)local_7f0 & 0xffffffffffffff00);
                    local_7f8 = &PTR__lazy_ostream_00236060;
                    local_7e8 = &boost::unit_test::lazy_ostream::inst;
                    local_7e0 = (undefined4 **)0x1f3264;
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = mc1.matrix_.matrix_._M_h._M_bucket_count;
                    uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar6,0);
                    if (mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                        (__node_base_ptr)0x0) {
                      p_Var2 = mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
                      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                      do {
                        if (uVar1 == 6) {
                          local_820._0_4_ = *(int *)&p_Var2[4]._M_nxt;
                          local_82c = 2;
                          local_7b8._0_1_ = (int)local_820 == 2;
                          local_7b0 = 0;
                          sStack_7a8.pi_ = (sp_counted_base *)0x0;
                          local_7d0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_7c8 = "";
                          local_798 = &local_820;
                          mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_functor._M_unused._M_member_pointer =
                               mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                               super__Function_base._M_functor._M_unused._M_member_pointer &
                               0xffffffffffffff00;
                          mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
                          mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_functor._8_8_ = &boost::unit_test::lazy_ostream::inst;
                          local_828 = &local_82c;
                          local_810 = (char *)((ulong)local_810 & 0xffffffffffffff00);
                          local_818 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                          sStack_808.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                          local_800 = &local_828;
                          mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_manager = (_Manager_type)&local_798;
                          boost::test_tools::tt_detail::report_assertion
                                    (&local_7b8,&local_7f8,&local_7d0,0x170,1,2,2,
                                     "mc1.get_column_dimension(6)",&mm,"2",&local_818);
                          boost::detail::shared_count::~shared_count(&sStack_7a8);
                          local_210 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_208 = "";
                          local_220 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_218 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_210,0x171);
                          local_7f0 = (char *)((ulong)local_7f0 & 0xffffffffffffff00);
                          local_7f8 = &PTR__lazy_ostream_00236060;
                          local_7e8 = &boost::unit_test::lazy_ostream::inst;
                          local_7e0 = (undefined4 **)0x1f3264;
                          local_7b8._0_1_ = (int)mc2.matrix_.matrix_._M_h._M_element_count == 7;
                          local_82c = 7;
                          local_7b0 = 0;
                          sStack_7a8.pi_ = (sp_counted_base *)0x0;
                          local_7d0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_7c8 = "";
                          local_798 = &local_820;
                          mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_functor._M_unused._M_member_pointer =
                               mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                               super__Function_base._M_functor._M_unused._M_member_pointer &
                               0xffffffffffffff00;
                          mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00235fd0;
                          mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_functor._8_8_ = &boost::unit_test::lazy_ostream::inst;
                          local_828 = &local_82c;
                          local_810 = (char *)((ulong)local_810 & 0xffffffffffffff00);
                          local_818 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                          sStack_808.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                          local_800 = &local_828;
                          mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base.
                          _M_manager = (_Manager_type)&local_798;
                          boost::test_tools::tt_detail::report_assertion();
                          boost::detail::shared_count::~shared_count(&sStack_7a8);
                          local_230 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_228 = "";
                          local_240 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_238 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_230,0x172);
                          local_7f0 = (char *)((ulong)local_7f0 & 0xffffffffffffff00);
                          local_7f8 = &PTR__lazy_ostream_00236060;
                          local_7e8 = &boost::unit_test::lazy_ostream::inst;
                          local_7e0 = (undefined4 **)0x1f3264;
                          auVar7._8_8_ = 0;
                          auVar7._0_8_ = mc2.matrix_.matrix_._M_h._M_bucket_count;
                          uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar7,0);
                          if (mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                              (__node_base_ptr)0x0) {
                            p_Var2 = mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->
                                     _M_nxt;
                            uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                            do {
                              if (uVar1 == 2) {
                                local_820._0_4_ = *(int *)&p_Var2[4]._M_nxt;
                                local_82c = 0;
                                local_7b8._0_1_ = (int)local_820 == 0;
                                local_7b0 = 0;
                                sStack_7a8.pi_ = (sp_counted_base *)0x0;
                                local_7d0 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_7c8 = "";
                                local_798 = &local_820;
                                mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                super__Function_base._M_functor._M_unused._M_member_pointer =
                                     mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                     super__Function_base._M_functor._M_unused._M_member_pointer &
                                     0xffffffffffffff00;
                                mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00236020;
                                mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                super__Function_base._M_functor._8_8_ =
                                     &boost::unit_test::lazy_ostream::inst;
                                local_828 = &local_82c;
                                local_810 = (char *)((ulong)local_810 & 0xffffffffffffff00);
                                local_818 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                                sStack_808.pi_ =
                                     (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                local_800 = &local_828;
                                mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                super__Function_base._M_manager = (_Manager_type)&local_798;
                                boost::test_tools::tt_detail::report_assertion
                                          (&local_7b8,&local_7f8,&local_7d0,0x172,1,2,2,
                                           "mc2.get_column_dimension(2)",&mm,"0",&local_818);
                                boost::detail::shared_count::~shared_count(&sStack_7a8);
                                local_250 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_248 = "";
                                local_260 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_258 = &boost::unit_test::basic_cstring<char_const>::null;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           &local_250,0x173);
                                local_7f0 = (char *)((ulong)local_7f0 & 0xffffffffffffff00);
                                local_7f8 = &PTR__lazy_ostream_00236060;
                                local_7e8 = &boost::unit_test::lazy_ostream::inst;
                                local_7e0 = (undefined4 **)0x1f3264;
                                auVar8._8_8_ = 0;
                                auVar8._0_8_ = mc2.matrix_.matrix_._M_h._M_bucket_count;
                                uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar8,0);
                                if (mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                                    (__node_base_ptr)0x0) {
                                  p_Var2 = mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]
                                           ->_M_nxt;
                                  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                  do {
                                    if (uVar1 == 6) {
                                      local_820 = (undefined4 *)
                                                  CONCAT44(local_820._4_4_,*(int *)&p_Var2[4]._M_nxt
                                                          );
                                      local_82c = 2;
                                      local_7b8 = (undefined4 ***)
                                                  CONCAT71(local_7b8._1_7_,
                                                           *(int *)&p_Var2[4]._M_nxt == 2);
                                      local_7b0 = 0;
                                      sStack_7a8.pi_ = (sp_counted_base *)0x0;
                                      local_7d0 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_7c8 = "";
                                      local_798 = &local_820;
                                      mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_functor._M_unused._M_member_pointer =
                                           mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                           super__Function_base._M_functor._M_unused.
                                           _M_member_pointer & 0xffffffffffffff00;
                                      mm.colSettings_ =
                                           (Column_settings *)&PTR__lazy_ostream_00236020;
                                      mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_functor._8_8_ =
                                           &boost::unit_test::lazy_ostream::inst;
                                      local_828 = &local_82c;
                                      local_810 = (char *)((ulong)local_810 & 0xffffffffffffff00);
                                      local_818 = (undefined4 ****)&PTR__lazy_ostream_00236020;
                                      sStack_808.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_800 = &local_828;
                                      mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_manager = (_Manager_type)&local_798;
                                      boost::test_tools::tt_detail::report_assertion
                                                (&local_7b8,&local_7f8,&local_7d0,0x173,1,2,2,
                                                 "mc2.get_column_dimension(6)",&mm,"2",&local_818);
                                      boost::detail::shared_count::~shared_count(&sStack_7a8);
                                      mm.matrix_.super_Matrix_row_access_option =
                                           mb.matrix_.super_Matrix_row_access_option;
                                      mm.colSettings_ = mb.colSettings_;
                                      mb.colSettings_ = (Column_settings *)0x0;
                                      mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_functor._M_unused._M_object =
                                           (void *)0x0;
                                      mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_functor._8_8_ = 0;
                                      mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_manager = (_Manager_type)0x0;
                                      mm.matrix_.super_Chain_vine_swap_option.birthComp_._M_invoker
                                           = mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                             _M_invoker;
                                      if (mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                          super__Function_base._M_manager != (_Manager_type)0x0) {
                                        mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_functor._M_unused._M_object =
                                             mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                             super__Function_base._M_functor._M_unused._M_object;
                                        mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_functor._8_8_ =
                                             mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                             super__Function_base._M_functor._8_8_;
                                        mm.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_manager =
                                             mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                             super__Function_base._M_manager;
                                        mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_manager = (_Manager_type)0x0;
                                        mb.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        _M_invoker = (_Invoker_type)0x0;
                                      }
                                      mm.matrix_.super_Chain_vine_swap_option.deathComp_.
                                      super__Function_base._M_functor._M_unused._M_object =
                                           (void *)0x0;
                                      mm.matrix_.super_Chain_vine_swap_option.deathComp_.
                                      super__Function_base._M_functor._8_8_ = 0;
                                      mm.matrix_.super_Chain_vine_swap_option.deathComp_.
                                      super__Function_base._M_manager = (_Manager_type)0x0;
                                      mm.matrix_.super_Chain_vine_swap_option.deathComp_._M_invoker
                                           = mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                             _M_invoker;
                                      if (mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                          super__Function_base._M_manager != (_Manager_type)0x0) {
                                        mm.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_functor._M_unused._M_object =
                                             mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_functor._M_unused._M_object;
                                        mm.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_functor._8_8_ =
                                             mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_functor._8_8_;
                                        mm.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_manager =
                                             mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_manager;
                                        mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_manager = (_Manager_type)0x0;
                                        mb.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        _M_invoker = (_Invoker_type)0x0;
                                      }
                                      mb.matrix_.super_Matrix_row_access_option.rows_ =
                                           (vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                                            *)0x0;
                                      std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::_Hashtable(&mm.matrix_.matrix_._M_h,&mb.matrix_.matrix_);
                                      std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::_Hashtable(&mm.matrix_.pivotToColumnIndex_._M_h,
                                                   &mb.matrix_.pivotToColumnIndex_);
                                      mm.matrix_.colSettings_ = mb.matrix_.colSettings_;
                                      mm.matrix_.nextIndex_ = mb.matrix_.nextIndex_;
                                      mb.matrix_.nextIndex_ = 0;
                                      mb.matrix_.colSettings_ = (Column_settings *)0x0;
                                      local_270 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_268 = "";
                                      local_280 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_278 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,&local_270,0x177);
                                      local_7b0 = local_7b0 & 0xffffffffffffff00;
                                      local_7b8 = (undefined4 ***)&PTR__lazy_ostream_00236060;
                                      sStack_7a8.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_7a0 = "";
                                      local_82c = (int)mm.matrix_.matrix_._M_h._M_element_count;
                                      local_7d4 = 7;
                                      local_7c8 = (char *)0x0;
                                      sStack_7c0.pi_ = (sp_counted_base *)0x0;
                                      local_798 = (undefined4 **)0x1f32e6;
                                      local_790 = "";
                                      local_828 = &local_82c;
                                      local_810 = (char *)((ulong)local_810 & 0xffffffffffffff00);
                                      local_818 = (undefined4 ****)&PTR__lazy_ostream_00235fd0;
                                      sStack_808.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_800 = &local_828;
                                      local_7f0 = (char *)((ulong)local_7f0 & 0xffffffffffffff00);
                                      local_7f8 = &PTR__lazy_ostream_00236020;
                                      local_7e8 = &boost::unit_test::lazy_ostream::inst;
                                      local_7e0 = &local_820;
                                      local_820 = &local_7d4;
                                      local_7d0._0_1_ =
                                           (_func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                            )((int)mm.matrix_.matrix_._M_h._M_element_count == 7);
                                      boost::test_tools::tt_detail::report_assertion();
                                      boost::detail::shared_count::~shared_count(&sStack_7c0);
                                      local_290 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_288 = "";
                                      local_2a0 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_298 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,&local_290,0x178);
                                      local_7b0 = local_7b0 & 0xffffffffffffff00;
                                      local_7b8 = (undefined4 ***)&PTR__lazy_ostream_00236060;
                                      sStack_7a8.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_7a0 = "";
                                      auVar9._8_8_ = 0;
                                      auVar9._0_8_ = mm.matrix_.matrix_._M_h._M_bucket_count;
                                      uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar9,0);
                                      if (mm.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                                          (__node_base_ptr)0x0) {
                                        p_Var2 = mm.matrix_.matrix_._M_h._M_buckets
                                                 [uVar14 & 0xffffffff]->_M_nxt;
                                        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                        do {
                                          if (uVar1 == 2) {
                                            local_82c = *(int *)&p_Var2[4]._M_nxt;
                                            local_7d4 = 0;
                                            local_7d0._0_1_ =
                                                 (_func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )(local_82c == 0);
                                            local_7c8 = (char *)0x0;
                                            sStack_7c0.pi_ = (sp_counted_base *)0x0;
                                            local_798 = (undefined4 **)0x1f32e6;
                                            local_790 = "";
                                            local_828 = &local_82c;
                                            local_810 = (char *)((ulong)local_810 &
                                                                0xffffffffffffff00);
                                            local_818 = (undefined4 ****)&PTR__lazy_ostream_00236020
                                            ;
                                            sStack_808.pi_ =
                                                 (sp_counted_base *)
                                                 &boost::unit_test::lazy_ostream::inst;
                                            local_800 = &local_828;
                                            local_7f0 = (char *)((ulong)local_7f0 &
                                                                0xffffffffffffff00);
                                            local_7f8 = &PTR__lazy_ostream_00236020;
                                            local_7e8 = &boost::unit_test::lazy_ostream::inst;
                                            local_7e0 = &local_820;
                                            local_820 = &local_7d4;
                                            boost::test_tools::tt_detail::report_assertion
                                                      (&local_7d0,&local_7b8,&local_798,0x178,1,2,2,
                                                       "mm.get_column_dimension(2)",&local_818,"0",
                                                       &local_7f8);
                                            boost::detail::shared_count::~shared_count(&sStack_7c0);
                                            local_2b0 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                            ;
                                            local_2a8 = "";
                                            local_2c0 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            local_2b8 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            boost::unit_test::unit_test_log_t::set_checkpoint
                                                      (boost::unit_test::(anonymous_namespace)::
                                                       unit_test_log,&local_2b0,0x179);
                                            local_7b0 = local_7b0 & 0xffffffffffffff00;
                                            local_7b8 = (undefined4 ***)&PTR__lazy_ostream_00236060;
                                            sStack_7a8.pi_ =
                                                 (sp_counted_base *)
                                                 &boost::unit_test::lazy_ostream::inst;
                                            local_7a0 = "";
                                            auVar10._8_8_ = 0;
                                            auVar10._0_8_ = mm.matrix_.matrix_._M_h._M_bucket_count;
                                            uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) %
                                                            auVar10,0);
                                            if (mm.matrix_.matrix_._M_h._M_buckets
                                                [uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
                                              p_Var2 = mm.matrix_.matrix_._M_h._M_buckets
                                                       [uVar14 & 0xffffffff]->_M_nxt;
                                              uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                              do {
                                                if (uVar1 == 6) {
                                                  local_82c = *(int *)&p_Var2[4]._M_nxt;
                                                  local_7d4 = 2;
                                                  local_7d0._0_1_ =
                                                       (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )(local_82c == 2);
                                                  local_7c8 = (char *)0x0;
                                                  sStack_7c0.pi_ = (sp_counted_base *)0x0;
                                                  local_798 = (undefined4 **)0x1f32e6;
                                                  local_790 = "";
                                                  local_828 = &local_82c;
                                                  local_810 = (char *)((ulong)local_810 &
                                                                      0xffffffffffffff00);
                                                  local_818 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00236020;
                                                  sStack_808.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_800 = &local_828;
                                                  local_7f0 = (char *)((ulong)local_7f0 &
                                                                      0xffffffffffffff00);
                                                  local_7f8 = &PTR__lazy_ostream_00236020;
                                                  local_7e8 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e0 = &local_820;
                                                  local_820 = &local_7d4;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_7d0,&local_7b8,&local_798,0x179,
                                                             1,2,2,"mm.get_column_dimension(6)",
                                                             &local_818,"2",&local_7f8);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7c0);
                                                  local_2d0 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_2c8 = "";
                                                  local_2e0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_2d8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_2d0,0x17a);
                                                  local_7b0 = local_7b0 & 0xffffffffffffff00;
                                                  local_7b8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_7a8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_7a0 = "";
                                                  local_82c = (int)mb.matrix_.matrix_._M_h.
                                                                   _M_element_count;
                                                  local_7d0._0_1_ =
                                                       (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )((int)mb.matrix_.matrix_._M_h._M_element_count ==
                                                   0);
                                                  local_7d4 = 0;
                                                  local_7c8 = (char *)0x0;
                                                  sStack_7c0.pi_ = (sp_counted_base *)0x0;
                                                  local_798 = (undefined4 **)0x1f32e6;
                                                  local_790 = "";
                                                  local_828 = &local_82c;
                                                  local_810 = (char *)((ulong)local_810 &
                                                                      0xffffffffffffff00);
                                                  local_818 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00235fd0;
                                                  sStack_808.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_800 = &local_828;
                                                  local_7f0 = (char *)((ulong)local_7f0 &
                                                                      0xffffffffffffff00);
                                                  local_7f8 = &PTR__lazy_ostream_00236020;
                                                  local_7e8 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e0 = &local_820;
                                                  local_820 = &local_7d4;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7c0);
                                                  Gudhi::persistence_matrix::swap
                                                            (&mm.matrix_,&mb.matrix_);
                                                  pCVar13 = mm.colSettings_;
                                                  mm.colSettings_ = mb.colSettings_;
                                                  mb.colSettings_ = pCVar13;
                                                  local_2f0 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_2e8 = "";
                                                  local_300 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_2f8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_2f0,0x17e);
                                                  local_7b0 = local_7b0 & 0xffffffffffffff00;
                                                  local_7b8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_7a8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_7a0 = "";
                                                  local_82c = (int)mm.matrix_.matrix_._M_h.
                                                                   _M_element_count;
                                                  local_7d0._0_1_ =
                                                       (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )((int)mm.matrix_.matrix_._M_h._M_element_count ==
                                                   0);
                                                  local_7d4 = 0;
                                                  local_7c8 = (char *)0x0;
                                                  sStack_7c0.pi_ = (sp_counted_base *)0x0;
                                                  local_798 = (undefined4 **)0x1f32e6;
                                                  local_790 = "";
                                                  local_828 = &local_82c;
                                                  local_810 = (char *)((ulong)local_810 &
                                                                      0xffffffffffffff00);
                                                  local_818 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00235fd0;
                                                  sStack_808.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_800 = &local_828;
                                                  local_7f0 = (char *)((ulong)local_7f0 &
                                                                      0xffffffffffffff00);
                                                  local_7f8 = &PTR__lazy_ostream_00236020;
                                                  local_7e8 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e0 = &local_820;
                                                  local_820 = &local_7d4;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7c0);
                                                  local_310 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_308 = "";
                                                  local_320 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_318 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_310,0x17f);
                                                  local_7b0 = local_7b0 & 0xffffffffffffff00;
                                                  local_7b8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_7a8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_7a0 = "";
                                                  local_82c = (int)mb.matrix_.matrix_._M_h.
                                                                   _M_element_count;
                                                  local_7d0._0_1_ =
                                                       (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )((int)mb.matrix_.matrix_._M_h._M_element_count ==
                                                   7);
                                                  local_7d4 = 7;
                                                  local_7c8 = (char *)0x0;
                                                  sStack_7c0.pi_ = (sp_counted_base *)0x0;
                                                  local_798 = (undefined4 **)0x1f32e6;
                                                  local_790 = "";
                                                  local_828 = &local_82c;
                                                  local_810 = (char *)((ulong)local_810 &
                                                                      0xffffffffffffff00);
                                                  local_818 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00235fd0;
                                                  sStack_808.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_800 = &local_828;
                                                  local_7f0 = (char *)((ulong)local_7f0 &
                                                                      0xffffffffffffff00);
                                                  local_7f8 = &PTR__lazy_ostream_00236020;
                                                  local_7e8 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e0 = &local_820;
                                                  local_820 = &local_7d4;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7c0);
                                                  local_330 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_328 = "";
                                                  local_340 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_338 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_330,0x180);
                                                  local_7b0 = local_7b0 & 0xffffffffffffff00;
                                                  local_7b8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_7a8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_7a0 = "";
                                                  auVar11._8_8_ = 0;
                                                  auVar11._0_8_ =
                                                       mb.matrix_.matrix_._M_h._M_bucket_count;
                                                  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2))
                                                                  % auVar11,0);
                                                  if (mb.matrix_.matrix_._M_h._M_buckets
                                                      [uVar14 & 0xffffffff] != (__node_base_ptr)0x0)
                                                  {
                                                    p_Var2 = mb.matrix_.matrix_._M_h._M_buckets
                                                             [uVar14 & 0xffffffff]->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 2) {
                                                        local_82c = *(int *)&p_Var2[4]._M_nxt;
                                                        local_7d4 = 0;
                                                        local_7d0._0_1_ =
                                                             (
                                                  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation
                                                  )(local_82c == 0);
                                                  local_7c8 = (char *)0x0;
                                                  sStack_7c0.pi_ = (sp_counted_base *)0x0;
                                                  local_798 = (undefined4 **)0x1f32e6;
                                                  local_790 = "";
                                                  local_828 = &local_82c;
                                                  local_810 = (char *)((ulong)local_810 &
                                                                      0xffffffffffffff00);
                                                  local_818 = (undefined4 ****)
                                                              &PTR__lazy_ostream_00236020;
                                                  sStack_808.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_800 = &local_828;
                                                  local_7f0 = (char *)((ulong)local_7f0 &
                                                                      0xffffffffffffff00);
                                                  local_7f8 = &PTR__lazy_ostream_00236020;
                                                  local_7e8 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e0 = &local_820;
                                                  local_820 = &local_7d4;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_7d0,&local_7b8,&local_798,0x180,
                                                             1,2,2,"mb.get_column_dimension(2)",
                                                             &local_818,"0",&local_7f8);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7c0);
                                                  local_350 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_348 = "";
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_350,0x181);
                                                  local_7b0 = local_7b0 & 0xffffffffffffff00;
                                                  local_7b8 = (undefined4 ***)
                                                              &PTR__lazy_ostream_00236060;
                                                  sStack_7a8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_7a0 = "";
                                                  auVar12._8_8_ = 0;
                                                  auVar12._0_8_ =
                                                       mb.matrix_.matrix_._M_h._M_bucket_count;
                                                  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6))
                                                                  % auVar12,0);
                                                  if (mb.matrix_.matrix_._M_h._M_buckets
                                                      [uVar14 & 0xffffffff] != (__node_base_ptr)0x0)
                                                  {
                                                    p_Var2 = mb.matrix_.matrix_._M_h._M_buckets
                                                             [uVar14 & 0xffffffff]->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 6) {
                                                        local_82c = *(int *)&p_Var2[4]._M_nxt;
                                                        local_7d4 = 2;
                                                        local_7d0 = (char *)CONCAT71(local_7d0._1_7_
                                                                                     ,local_82c == 2
                                                                                    );
                                                        local_7c8 = (char *)0x0;
                                                        sStack_7c0.pi_ = (sp_counted_base *)0x0;
                                                        local_798 = (undefined4 **)0x1f32e6;
                                                        local_790 = "";
                                                        local_828 = &local_82c;
                                                        local_810 = (char *)((ulong)local_810 &
                                                                            0xffffffffffffff00);
                                                        local_818 = (undefined4 ****)
                                                                    &PTR__lazy_ostream_00236020;
                                                        sStack_808.pi_ =
                                                             (sp_counted_base *)
                                                             &boost::unit_test::lazy_ostream::inst;
                                                        local_800 = &local_828;
                                                        local_7f0 = (char *)((ulong)local_7f0 &
                                                                            0xffffffffffffff00);
                                                        local_7f8 = &PTR__lazy_ostream_00236020;
                                                        local_7e8 = &boost::unit_test::lazy_ostream
                                                                     ::inst;
                                                        local_7e0 = &local_820;
                                                        local_820 = &local_7d4;
                                                        boost::test_tools::tt_detail::
                                                        report_assertion(&local_7d0,&local_7b8,
                                                                         &local_798,0x181,1,2,2,
                                                                                                                                                  
                                                  "mb.get_column_dimension(6)",&local_818,"2",
                                                  &local_7f8);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7c0);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                                                  ::~Matrix(&mm);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                                                  ::~Matrix(&mc2);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                                                  ::~Matrix(&mc1);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                                                  ::~Matrix(&mr);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                                                  ::~Matrix(&mb);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
                                                  ::~Matrix(&m);
                                                  std::
                                                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ::~vector(&ordered_boundaries);
                                                  return;
                                                  }
                                                  p_Var2 = p_Var2->_M_nxt;
                                                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          mb.matrix_.matrix_._M_h._M_bucket_count ==
                                                          uVar14));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var2 = p_Var2->_M_nxt;
                                                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          mb.matrix_.matrix_._M_h._M_bucket_count ==
                                                          uVar14));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                }
                                                p_Var2 = p_Var2->_M_nxt;
                                              } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                      (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                      (ulong)uVar1 %
                                                      mm.matrix_.matrix_._M_h._M_bucket_count ==
                                                      uVar14));
                                            }
                                            std::__throw_out_of_range("_Map_base::at");
                                          }
                                          p_Var2 = p_Var2->_M_nxt;
                                        } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                (ulong)uVar1 %
                                                mm.matrix_.matrix_._M_h._M_bucket_count == uVar14));
                                      }
                                      std::__throw_out_of_range("_Map_base::at");
                                    }
                                    p_Var2 = p_Var2->_M_nxt;
                                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                          (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                          (ulong)uVar1 % mc2.matrix_.matrix_._M_h._M_bucket_count ==
                                          uVar14));
                                }
                                std::__throw_out_of_range("_Map_base::at");
                              }
                              p_Var2 = p_Var2->_M_nxt;
                            } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                    (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                    (ulong)uVar1 % mc2.matrix_.matrix_._M_h._M_bucket_count ==
                                    uVar14));
                          }
                          std::__throw_out_of_range("_Map_base::at");
                        }
                        p_Var2 = p_Var2->_M_nxt;
                      } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                              (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                              (ulong)uVar1 % mc1.matrix_.matrix_._M_h._M_bucket_count == uVar14));
                    }
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var2 = p_Var2->_M_nxt;
                } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                        (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                        (ulong)uVar1 % mc1.matrix_.matrix_._M_h._M_bucket_count == uVar14));
              }
              std::__throw_out_of_range("_Map_base::at");
            }
            p_Var2 = p_Var2->_M_nxt;
          } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                  (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                  (ulong)uVar1 % mb.matrix_.matrix_._M_h._M_bucket_count == uVar14));
        }
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % mb.matrix_.matrix_._M_h._M_bucket_count == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}